

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void load256i128(uint16_t *out,secp256k1_int128 *v)

{
  secp256k1_int128 sVar1;
  uint64_t hi;
  long local_28;
  long local_20;
  
  sVar1 = *v;
  local_28 = *(long *)((long)v + 8);
  local_20 = local_28 >> 0x3f;
  hi = secp256k1_i128_to_i64((secp256k1_int128 *)&local_28);
  load256two64(out,hi,(uint64_t)sVar1,1);
  return;
}

Assistant:

static void load256i128(uint16_t* out, const secp256k1_int128* v) {
    uint64_t lo;
    int64_t hi;
    secp256k1_int128 c = *v;
    lo = secp256k1_i128_to_u64(&c);
    secp256k1_i128_rshift(&c, 64);
    hi = secp256k1_i128_to_i64(&c);
    load256two64(out, hi, lo, 1);
}